

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinRoberts_fp.c
# Opt level: O0

int funcRoberts(N_Vector y,N_Vector g,void *user_data)

{
  double dVar1;
  double dVar2;
  sunrealtype yd3;
  sunrealtype yd1;
  sunrealtype y3;
  sunrealtype y2;
  sunrealtype y1;
  void *user_data_local;
  N_Vector g_local;
  N_Vector y_local;
  
  dVar2 = *(double *)(*(long *)((long)y->content + 0x10) + 8);
  dVar1 = (**(double **)((long)y->content + 0x10) * -0.04 +
          dVar2 * 10000.0 * *(double *)(*(long *)((long)y->content + 0x10) + 0x10)) * 0.1;
  dVar2 = dVar2 * 30.0 * dVar2;
  **(double **)((long)g->content + 0x10) = dVar1 + 1.0;
  *(double *)(*(long *)((long)g->content + 0x10) + 8) = (-dVar1 - dVar2) + 0.0;
  *(double *)(*(long *)((long)g->content + 0x10) + 0x10) = dVar2 + 0.0;
  return 0;
}

Assistant:

static int funcRoberts(N_Vector y, N_Vector g, void* user_data)
{
  sunrealtype y1, y2, y3;
  sunrealtype yd1, yd3;

  y1 = Ith(y, 1);
  y2 = Ith(y, 2);
  y3 = Ith(y, 3);

  yd1 = DSTEP * (SUN_RCONST(-0.04) * y1 + SUN_RCONST(1.0e4) * y2 * y3);
  yd3 = DSTEP * SUN_RCONST(3.0e2) * y2 * y2;

  Ith(g, 1) = yd1 + Y10;
  Ith(g, 2) = -yd1 - yd3 + Y20;
  Ith(g, 3) = yd3 + Y30;

  return (0);
}